

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

bool readLine(FILE *fp,string *str)

{
  int iVar1;
  __ssize_t _Var2;
  char *line;
  size_t n;
  allocator local_49;
  char *local_48;
  size_t local_40;
  long *local_38 [2];
  long local_28 [2];
  
  iVar1 = feof((FILE *)fp);
  if ((iVar1 == 0) && (iVar1 = ferror((FILE *)fp), iVar1 == 0)) {
    local_48 = (char *)0x0;
    local_40 = 0;
    _Var2 = getline(&local_48,&local_40,(FILE *)fp);
    if (_Var2 == 0) {
      return false;
    }
    if (local_40 == 0) {
      return false;
    }
    std::__cxx11::string::string((string *)local_38,local_48,&local_49);
    std::__cxx11::string::operator=((string *)str,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    free(local_48);
    if ((str->_M_string_length != 0) || (iVar1 = feof((FILE *)fp), iVar1 == 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool readLine(FILE *fp, std::string &str) {
  if (feof(fp) || ferror(fp))
    return false;
  char *line = nullptr;
  size_t n = 0;
  if (!getline(&line, &n, fp) || n == 0)
    return false;
  str = std::string(line);
  free(line);
  if (str.size() == 0 && feof(fp))
    return false;
  else
    return true;
}